

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O1

bool tinyusdz::usda::anon_unknown_1::ToPrimSpecRec
               (size_t primSpecIdx,
               vector<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
               *primspec_nodes,PrimSpec *parent,string *err)

{
  _Rb_tree_header *p_Var1;
  pointer pPVar2;
  size_t sVar3;
  size_t *psVar4;
  size_t sVar5;
  bool bVar6;
  ulong uVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Link_type p_Var10;
  _Link_type p_Var11;
  unsigned_long *cidx;
  size_t *psVar12;
  bool bVar13;
  char cVar14;
  int64_t vidx;
  VariantSetSpec variantSet;
  set<long,_std::less<long>,_std::allocator<long>_> variantChildrenIndices;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
  variantSets;
  PrimSpec variant;
  PrimSpec primspec;
  PrimSpec variantChildPrim;
  int local_1184;
  ulong local_1180;
  _Base_ptr local_1178;
  _Base_ptr local_1170;
  PrimSpec *local_1168;
  pointer local_1160;
  _Base_ptr local_1158;
  _Base_ptr local_1150;
  _Base_ptr local_1148;
  _Base_ptr local_1140;
  undefined1 local_1138 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
  local_1118;
  string local_10e8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_10c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
  local_1098;
  undefined1 local_1068 [96];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  local_1008 [216];
  PrimMetas local_f30;
  PrimSpec local_b00;
  undefined1 local_598 [1384];
  
  pPVar2 = (primspec_nodes->
           super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)(primspec_nodes->
                 super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 3) *
          0x6fe99e1395aedd07;
  if (uVar7 < primSpecIdx || uVar7 - primSpecIdx == 0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    return false;
  }
  local_1160 = pPVar2 + primSpecIdx;
  local_1168 = parent;
  PrimSpec::PrimSpec(&local_b00,&local_1160->primSpec);
  p_Var1 = &local_10c8._M_impl.super__Rb_tree_header;
  local_10c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_10c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_10c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1098._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1098._M_impl.super__Rb_tree_header._M_header;
  local_1098._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1098._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1098._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1158 = (_Base_ptr)((long)&pPVar2[primSpecIdx].variantNodeMap._M_t._M_impl + 8);
  p_Var9 = *(_Base_ptr *)((long)&pPVar2[primSpecIdx].variantNodeMap._M_t._M_impl + 0x18);
  local_10c8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_10c8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_1098._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1098._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var9 != local_1158) {
    do {
      local_1138._0_8_ = local_1138 + 0x10;
      local_1178 = p_Var9 + 1;
      local_1138._8_8_ = 0;
      local_1138[0x10] = '\0';
      local_1118._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1118._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1118._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_1118._M_impl.super__Rb_tree_header._M_header;
      local_1118._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var8 = p_Var9[2]._M_right;
      local_1148 = (_Base_ptr)&p_Var9[2]._M_parent;
      local_1150 = p_Var9;
      local_1118._M_impl.super__Rb_tree_header._M_header._M_right =
           local_1118._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var8 != local_1148) {
        do {
          PrimSpec::PrimSpec((PrimSpec *)local_1068);
          p_Var9 = p_Var8[0x23]._M_parent;
          local_1140 = p_Var8[0x23]._M_left;
          local_1184 = 6;
          bVar13 = p_Var9 == local_1140;
          local_1170 = p_Var8;
          while (!bVar13) {
            local_1180 = *(ulong *)p_Var9;
            p_Var10 = (_Link_type)p_Var1;
            for (p_Var11 = (_Link_type)local_10c8._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var11 != (_Link_type)0x0;
                p_Var11 = *(_Link_type *)
                           (&p_Var11->_M_storage)[(ulong)((long)sVar3 < (long)local_1180) - 2].
                           _M_storage) {
              sVar3 = *(size_t *)(p_Var11->_M_storage)._M_storage;
              if ((long)local_1180 <= (long)sVar3) {
                p_Var10 = p_Var11;
              }
            }
            p_Var11 = (_Link_type)p_Var1;
            if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
               (p_Var11 = p_Var10,
               (long)local_1180 < (long)*(size_t *)(p_Var10->_M_storage)._M_storage)) {
              p_Var11 = (_Link_type)p_Var1;
            }
            if ((_Rb_tree_header *)p_Var11 != p_Var1) {
              if (err != (string *)0x0) {
                local_10e8._M_dataplus._M_p = (pointer)&local_10e8.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_10e8,
                           "variant primIdx {} is referenced multiple times.\n","");
                fmt::format<long>((string *)local_598,&local_10e8,(long *)&local_1180);
                ::std::__cxx11::string::operator=((string *)err,(string *)local_598);
                if ((undefined1 *)local_598._0_8_ != local_598 + 0x10) {
                  operator_delete((void *)local_598._0_8_,local_598._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_10e8._M_dataplus._M_p != &local_10e8.field_2) {
                  operator_delete(local_10e8._M_dataplus._M_p,
                                  local_10e8.field_2._M_allocated_capacity + 1);
                }
              }
LAB_00131f5b:
              local_1184 = 1;
              break;
            }
            if (((long)local_1180 < 0) ||
               ((ulong)(((long)(primspec_nodes->
                               super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(primspec_nodes->
                               super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6fe99e1395aedd07
                       ) < local_1180)) {
              if (err != (string *)0x0) {
                ::std::__cxx11::string::_M_replace
                          ((ulong)err,0,(char *)err->_M_string_length,0x4210af);
              }
              goto LAB_00131f5b;
            }
            PrimSpec::PrimSpec((PrimSpec *)local_598);
            bVar6 = ToPrimSpecRec(local_1180,primspec_nodes,(PrimSpec *)local_598,err);
            if (!bVar6) {
              PrimSpec::~PrimSpec((PrimSpec *)local_598);
              goto LAB_00131f5b;
            }
            ::std::vector<tinyusdz::PrimSpec,std::allocator<tinyusdz::PrimSpec>>::
            emplace_back<tinyusdz::PrimSpec&>
                      ((vector<tinyusdz::PrimSpec,std::allocator<tinyusdz::PrimSpec>> *)
                       (local_1068 + 0x48),(PrimSpec *)local_598);
            PrimSpec::~PrimSpec((PrimSpec *)local_598);
            ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
            _M_insert_unique<long_const&>
                      ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                        *)&local_10c8,(long *)&local_1180);
            p_Var9 = (_Base_ptr)&p_Var9->_M_parent;
            bVar13 = p_Var9 == local_1140;
          }
          p_Var9 = local_1170;
          if (bVar13) {
            p_Var8 = local_1170 + 1;
            PrimMetas::operator=(&local_f30,(PrimMetas *)(local_1170 + 2));
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::operator=(local_1008,
                        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                         *)&p_Var9[0x21]._M_right);
            ::std::__cxx11::string::_M_assign((string *)local_1138);
            ::std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>>
            ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::PrimSpec>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>>
                        *)&local_1118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var8,
                       (PrimSpec *)local_1068);
            local_1184 = 0;
          }
          PrimSpec::~PrimSpec((PrimSpec *)local_1068);
          if (local_1184 != 0) goto LAB_00131fe8;
          p_Var8 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)local_1170);
        } while (p_Var8 != local_1148);
      }
      local_1184 = 4;
LAB_00131fe8:
      if (local_1184 == 4) {
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::VariantSetSpec>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>>>
                    *)&local_1098,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1178,
                   (VariantSetSpec *)local_1138);
        local_1184 = 0;
      }
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
      ::_M_erase(&local_1118,
                 (_Link_type)local_1118._M_impl.super__Rb_tree_header._M_header._M_parent);
      if ((undefined1 *)local_1138._0_8_ != local_1138 + 0x10) {
        operator_delete((void *)local_1138._0_8_,CONCAT71(local_1138._17_7_,local_1138[0x10]) + 1);
      }
      if (local_1184 != 0) goto LAB_00132055;
      p_Var9 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)local_1150);
    } while (p_Var9 != local_1158);
    local_1184 = 2;
LAB_00132055:
    if (local_1184 != 2) {
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
      ::_M_erase(&local_1098,
                 (_Link_type)local_1098._M_impl.super__Rb_tree_header._M_header._M_parent);
LAB_00132191:
      bVar13 = false;
      goto LAB_00132193;
    }
  }
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
  ::operator=(&local_b00._variantSets,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
               *)&local_1098);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
  ::_M_erase(&local_1098,(_Link_type)local_1098._M_impl.super__Rb_tree_header._M_header._M_parent);
  psVar12 = *(size_t **)
             &(local_1160->children).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
  psVar4 = *(pointer *)
            ((long)&(local_1160->children).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8);
  if (psVar12 != psVar4) {
    do {
      sVar3 = *psVar12;
      p_Var10 = (_Link_type)p_Var1;
      for (p_Var11 = (_Link_type)local_10c8._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var11 != (_Link_type)0x0;
          p_Var11 = *(_Link_type *)
                     (&p_Var11->_M_storage)[(ulong)((long)sVar5 < (long)sVar3) - 2]._M_storage) {
        sVar5 = *(size_t *)(p_Var11->_M_storage)._M_storage;
        if ((long)sVar3 <= (long)sVar5) {
          p_Var10 = p_Var11;
        }
      }
      p_Var11 = (_Link_type)p_Var1;
      if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
         (p_Var11 = p_Var10, (long)sVar3 < (long)*(size_t *)(p_Var10->_M_storage)._M_storage)) {
        p_Var11 = (_Link_type)p_Var1;
      }
      cVar14 = '\t';
      if ((_Rb_tree_header *)p_Var11 == p_Var1) {
        PrimSpec::PrimSpec((PrimSpec *)local_1068);
        bVar13 = ToPrimSpecRec(*psVar12,primspec_nodes,(PrimSpec *)local_1068,err);
        cVar14 = !bVar13;
        if (!(bool)cVar14) {
          ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::
          emplace_back<tinyusdz::PrimSpec>(&local_b00._children,(PrimSpec *)local_1068);
        }
        PrimSpec::~PrimSpec((PrimSpec *)local_1068);
      }
      if ((cVar14 != '\t') && (cVar14 != '\0')) goto LAB_00132191;
      psVar12 = psVar12 + 1;
    } while (psVar12 != psVar4);
  }
  bVar13 = true;
  if (&local_b00 != local_1168) {
    PrimSpec::MoveFrom(local_1168,&local_b00);
  }
LAB_00132193:
  ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
  _M_erase(&local_10c8,(_Link_type)local_10c8._M_impl.super__Rb_tree_header._M_header._M_parent);
  PrimSpec::~PrimSpec(&local_b00);
  return bVar13;
}

Assistant:

bool ToPrimSpecRec(const size_t primSpecIdx,
                        std::vector<PrimSpecNode> &primspec_nodes, PrimSpec &parent, std::string *err) {

  if (primSpecIdx >= primspec_nodes.size()) {
    if (err) {
      (*err) += "Internal error; primSpecIdx exceeds primspec_nodes.size.";
    }
    return false;
  }

  const PrimSpecNode &node = primspec_nodes[primSpecIdx];

  PrimSpec primspec = node.primSpec;

  // Firstly process variants.
  std::set<int64_t> variantChildrenIndices; // record variantChildren indices
  {

    std::map<std::string, VariantSetSpec> variantSets;
    for (const auto &variantNodes : node.variantNodeMap) {
      DCOUT("variantSet " << variantNodes.first);
      VariantSetSpec variantSet;
      for (const auto &item : variantNodes.second) {
        DCOUT("variant " << item.first);
        PrimSpec variant; // variantNode can be represented as PrimSpec.
        for (const int64_t vidx : item.second.primChildren) {
          if (variantChildrenIndices.count(vidx)) {
            // Duplicated variant childrenIndices
            if (err) {
              (*err) = fmt::format("variant primIdx {} is referenced multiple times.\n", vidx);
            }
            return false;
          } else {
            // Add prim to variants
            if ((vidx >= 0) && (size_t(vidx) <= primspec_nodes.size())) {

              PrimSpec variantChildPrim; // dummy
              if (!ToPrimSpecRec(size_t(vidx), primspec_nodes, variantChildPrim, err)) {
                return false;
              }

              DCOUT(fmt::format("Added prim {} to variantSet {} : variant {}", variantChildPrim.name(), variantNodes.first, item.first));
              variant.children().emplace_back(variantChildPrim);
            } else {
              if (err) {
                (*err) = "primIndex exceeds prim_nodes.size()\n";
              }
              return false;
            }

            variantChildrenIndices.insert(vidx);
          }
        }

        variant.metas() = std::move(item.second.metas);
        variant.props() = std::move(item.second.props);

        variantSet.name = variantNodes.first;
        variantSet.variantSet.emplace(item.first, std::move(variant));
      }
      DCOUT(fmt::format("Add {} to variantSet", variantNodes.first));
      variantSets.emplace(variantNodes.first, std::move(variantSet));
    }
    primspec.variantSets() = std::move(variantSets);
  }

  for (const auto &cidx : node.children) {

    if (variantChildrenIndices.count(int64_t(cidx))) {
      // PrimSpec is already processed
      continue;
    }

    PrimSpec childPrimSpec;
    if (!ToPrimSpecRec(cidx, primspec_nodes, childPrimSpec, err)) {
      return false;
    }
    primspec.children().emplace_back(std::move(childPrimSpec));
  }

  parent = std::move(primspec);

  return true;
}